

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O2

void __thiscall btTriangleMesh::preallocateVertices(btTriangleMesh *this,int numverts)

{
  if (this->m_use4componentVertices == true) {
    btAlignedObjectArray<btVector3>::reserve(&this->m_4componentVertices,numverts);
    return;
  }
  btAlignedObjectArray<float>::reserve(&this->m_3componentVertices,numverts);
  return;
}

Assistant:

void btTriangleMesh::preallocateVertices(int numverts)
{
	if (m_use4componentVertices)
	{
		m_4componentVertices.reserve(numverts);
	} else
	{
		m_3componentVertices.reserve(numverts);
	}
}